

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

int flikam(double *P,int MP,double *Q,int MQ,double *W,double *E,int N,double *ssq,double *fact,
          double *VW,double *VL,int MRP1,double *VK,int MR,double TOLER)

{
  double dVar1;
  int MXPQ;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  uint b;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  long local_90;
  int local_5c;
  double local_50;
  uint local_38;
  
  *fact = 0.0;
  *ssq = 0.0;
  MXPQ = imax(MP,MQ);
  b = MQ + 1;
  iVar2 = twacf(P,MP,Q,MQ,VW,MXPQ + 1,VL,MXPQ + 1,VK,MXPQ);
  iVar3 = imax(MP,b);
  iVar15 = 6;
  if (iVar3 == MR) {
    iVar15 = iVar2;
  }
  local_5c = 7;
  if (MR + 1U == MRP1) {
    local_5c = iVar15;
  }
  if (local_5c < 1) {
    *VK = *VW;
    lVar5 = (long)MP;
    if ((MR != 1) && (1 < MR)) {
      lVar8 = (ulong)(MP + 1) - 2;
      uVar11 = 2;
      lVar13 = 1;
      pdVar9 = P;
      do {
        pdVar9 = pdVar9 + 1;
        VK[uVar11 - 1] = 0.0;
        if ((long)uVar11 <= lVar5) {
          dVar17 = VK[uVar11 - 1];
          lVar14 = 0;
          do {
            dVar17 = dVar17 + pdVar9[lVar14] * VW[lVar14 + 1];
            VK[uVar11 - 1] = dVar17;
            lVar14 = lVar14 + 1;
          } while (lVar8 != lVar14);
        }
        if ((long)uVar11 <= (long)(int)b) {
          dVar17 = VK[uVar11 - 1];
          pdVar10 = VL;
          lVar14 = lVar13;
          do {
            dVar17 = dVar17 - Q[lVar14 + -1] * *pdVar10;
            VK[uVar11 - 1] = dVar17;
            lVar14 = lVar14 + 1;
            pdVar10 = pdVar10 + 1;
          } while (lVar14 <= MQ);
        }
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + -1;
        lVar13 = lVar13 + 1;
      } while (uVar11 != MR + 1U);
    }
    dVar17 = *VK;
    VL[(long)MR + -1] = 0.0;
    if (0 < MR) {
      uVar11 = 0;
      do {
        VW[uVar11] = 0.0;
        if (MR - 1 != uVar11) {
          VL[uVar11] = VK[uVar11 + 1];
        }
        if ((long)uVar11 < lVar5) {
          VL[uVar11] = P[uVar11] * dVar17 + VL[uVar11];
        }
        VK[uVar11] = VL[uVar11];
        uVar11 = uVar11 + 1;
      } while ((uint)MR != uVar11);
    }
    VW[lVar5] = 0.0;
    VL[MXPQ] = 0.0;
    if (0 < N) {
      uVar6 = MP + 1;
      uVar11 = (ulong)(N + 1);
      uVar16 = 1;
      local_90 = 0;
      dVar22 = 1.0;
      local_50 = 0.0;
      pdVar9 = E;
      pdVar10 = W;
      local_38 = uVar6;
      uVar4 = MP;
      while (uVar16 != uVar6 - MQ) {
LAB_001185cc:
        if (dVar17 <= 1e-10) {
          return 8;
        }
        if (((long)MXPQ < (long)uVar16) && (ABS(dVar17 + -1.0) < TOLER)) goto LAB_001188bd;
        for (dVar22 = dVar22 * dVar17; 1.0 <= ABS(dVar22); dVar22 = dVar22 * 0.0625) {
          local_50 = local_50 + 4.0;
        }
        for (; ABS(dVar22) < 0.0625; dVar22 = dVar22 * 16.0) {
          local_50 = local_50 + -4.0;
        }
        dVar1 = *VW;
        dVar20 = W[uVar16 - 1];
        if (dVar17 < 0.0) {
          dVar18 = sqrt(dVar17);
        }
        else {
          dVar18 = SQRT(dVar17);
        }
        dVar20 = dVar20 - dVar1;
        E[uVar16 - 1] = dVar20 / dVar18;
        dVar19 = dVar20 / dVar17;
        *ssq = dVar20 * dVar19 + *ssq;
        dVar20 = *VL;
        dVar18 = -dVar20 / dVar17;
        if (0 < (int)uVar4) {
          uVar7 = 0;
          do {
            dVar21 = P[uVar7] * dVar20 + VL[uVar7 + 1];
            VW[uVar7] = VK[uVar7] * dVar19 + P[uVar7] * dVar1 + VW[uVar7 + 1];
            VL[uVar7] = VK[uVar7] * dVar18 + dVar21;
            VK[uVar7] = dVar21 * dVar18 + VK[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        if ((int)local_38 <= MQ) {
          lVar5 = (long)(int)local_38;
          lVar8 = 0;
          do {
            VW[lVar5 + lVar8 + -1] = VK[lVar5 + lVar8 + -1] * dVar19 + VW[lVar5 + lVar8];
            VL[lVar5 + lVar8 + -1] = VK[lVar5 + lVar8 + -1] * dVar18 + VL[lVar5 + lVar8];
            VK[lVar5 + lVar8 + -1] = VL[lVar5 + lVar8] * dVar18 + VK[lVar5 + lVar8 + -1];
            lVar8 = lVar8 + 1;
          } while (b - local_38 != (int)lVar8);
        }
        if ((int)local_38 <= MP) {
          lVar5 = (long)(int)local_38;
          lVar8 = 0;
          do {
            VW[lVar5 + lVar8 + -1] = P[lVar5 + lVar8 + -1] * W[uVar16 - 1] + VW[lVar5 + lVar8];
            lVar8 = lVar8 + 1;
          } while (uVar6 - local_38 != (int)lVar8);
        }
        dVar17 = dVar17 + dVar18 * dVar20;
        uVar16 = uVar16 + 1;
        local_90 = local_90 + 1;
        pdVar9 = pdVar9 + 1;
        pdVar10 = pdVar10 + 1;
        if (uVar16 == uVar11) goto LAB_001189f9;
      }
      uVar4 = imin(MP,MQ);
      if (0 < MQ) {
        local_38 = uVar4 + 1;
        goto LAB_001185cc;
      }
LAB_001188bd:
      iVar15 = (int)uVar16;
      if (iVar15 <= N) {
        lVar5 = 0;
        do {
          pdVar9[lVar5] = pdVar10[lVar5];
          lVar5 = lVar5 + 1;
        } while ((uVar16 - uVar11) + lVar5 != 0);
      }
      if (iVar15 <= N && MP != 0) {
        uVar7 = uVar16;
        do {
          if (0 < MP) {
            dVar17 = E[uVar7 - 1];
            lVar5 = -1;
            pdVar12 = P;
            do {
              dVar17 = dVar17 - *pdVar12 * pdVar10[lVar5];
              E[uVar7 - 1] = dVar17;
              pdVar12 = pdVar12 + 1;
              lVar5 = lVar5 + -1;
            } while (-lVar5 != (ulong)uVar6);
          }
          uVar7 = uVar7 + 1;
          pdVar10 = pdVar10 + 1;
        } while (uVar7 != uVar11);
      }
      if (iVar15 <= N && MQ != 0) {
        do {
          if (0 < MQ) {
            dVar17 = E[uVar16 - 1];
            lVar5 = -1;
            pdVar10 = Q;
            do {
              dVar17 = dVar17 + *pdVar10 * pdVar9[lVar5];
              E[uVar16 - 1] = dVar17;
              pdVar10 = pdVar10 + 1;
              lVar5 = lVar5 + -1;
            } while (-lVar5 != (ulong)b);
          }
          uVar16 = uVar16 + 1;
          pdVar9 = pdVar9 + 1;
        } while (uVar16 != uVar11);
      }
      local_5c = -iVar15;
      if (iVar15 <= N) {
        dVar17 = *ssq;
        do {
          dVar17 = dVar17 + E[local_90] * E[local_90];
          *ssq = dVar17;
          local_90 = local_90 + 1;
        } while (uVar11 - 1 != local_90);
      }
LAB_001189f9:
      dVar17 = pow(dVar22,1.0 / (double)N);
      dVar22 = exp2(local_50 / (double)N);
      *fact = dVar22 * dVar17;
      return local_5c;
    }
    local_5c = 9;
  }
  return local_5c;
}

Assistant:

int flikam(double *P, int MP, double *Q, int MQ,double *W, double *E, int N,double *ssq,double *fact,double *VW,double *VL,int MRP1,double *VK,int MR,double TOLER) {
	int ifault,MXPQ,MXPQP1,MQP1,MPP1,FLAG;
	int k,j,jp2mk,jp1mk,LAST,LOOP,JFROM,i,NEXTI,imj;
	double zero, p0625, one, two, four, sixteen,epsil1;
	double A, ALF, AOR, DETCAR, DETMAN, FLJ, R, VL1, VW1;

	zero = 0.0; p0625 = 0.0625; one = 1.0; two = 2.0; four = 4.0; sixteen = 16.0;
	epsil1 = 1.0e-10;

	*ssq = *fact = zero;
	DETMAN = one;
	DETCAR = zero;
	MXPQ = imax(MP, MQ);// Check
	MXPQP1 = MXPQ + 1;
	MQP1 = MQ + 1;
	MPP1 = MP + 1;
	FLAG = 0;

	ifault = twacf(P, MP,Q, MQ,VW,MXPQP1,VL, MXPQP1,VK,MXPQ);
	if (MR != imax(MP, MQP1)) {
		ifault = 6;
	}
	if (MRP1 != MR + 1) {
		ifault = 7;
	}

	if (ifault > 0) {
		return ifault;
	}

	VK[0] = VW[0];

	if (MR != 1) {
		for (k = 2; k <= MR; ++k) {
			VK[k - 1] = zero;
			if (k <= MP) {
				for (j = k; j <= MP; ++j) {
					jp2mk = j + 2 - k;
					VK[k - 1] += P[j - 1] * VW[jp2mk - 1];
				}
			}//120
			if (k <= MQP1) {
				for (j = k; j <= MQP1; ++j) {
					jp1mk = j + 1 - k;
					VK[k - 1] -= Q[j - 2] * VL[jp1mk - 1];
				}
			}
		}
	}//150

	R = VK[0];
	VL[MR - 1] = zero;
	for (j = 0; j < MR; ++j) {
		VW[j] = zero;
		if (j != MR - 1) {
			VL[j] = VK[j + 1];
		}
		if (j <= MP - 1) {
			VL[j] += P[j] * R;
		}
		VK[j] = VL[j];
	}

	LAST = MPP1 - MQ;
	LOOP = MP;
	JFROM = MPP1;
	VW[MPP1-1] = zero;
	VL[MXPQP1-1] = zero;

	if (N <= 0) {
		return 9;
	}

	for (i = 1; i <= N; ++i) {
		if (i == LAST) {
			LOOP = imin(MP, MQ);
			JFROM = LOOP + 1;
			if (MQ <= 0) {
				FLAG = 1;
				break;
			}
		}
		if (R <= epsil1) {
			return 8;
		}
		if (fabs(R - one) < TOLER && i > MXPQ) {
			FLAG = 1;
			break;
		}
		DETMAN *= R;
		while (fabs(DETMAN) >= one) {
			DETMAN *= p0625;
			DETCAR += four;
		}
		while (fabs(DETMAN) < p0625) {
			DETMAN *= sixteen;
			DETCAR -= four;
		}
		VW1 = VW[0];
		A = W[i - 1] - VW1;
		E[i - 1] = A / sqrt(R);
		AOR = A / R;
		*ssq += A*AOR;
		VL1 = VL[0];
		ALF = VL1 / R;
		R -= ALF * VL1;
		if (LOOP != 0) {
			for (j = 0; j < LOOP; ++j) {
				FLJ = VL[j + 1] + P[j] * VL1;
				VW[j] = VW[j + 1] + P[j] * VW1 + AOR * VK[j];
				VL[j] = FLJ - ALF * VK[j];
				VK[j] -= ALF * FLJ;
			}
		}

		if (JFROM <= MQ) {
			for (j = JFROM; j <= MQ; ++j) {
				VW[j - 1] = VW[j] + AOR * VK[j - 1];
				VL[j - 1] = VL[j] - ALF * VK[j - 1];
				VK[j - 1] -= ALF*VL[j];
			}
		}
		if (JFROM <= MP) {
			for (j = JFROM; j <= MP; ++j) {
				VW[j - 1] = VW[j] + P[j-1] * W[i-1];
			}
		}
	}

	if (FLAG == 1) {
		NEXTI = i;
		ifault = -NEXTI;
		for (i = NEXTI; i <= N; ++i) {
			E[i - 1] = W[i - 1];
		}
		if (MP != 0) {
			for (i = NEXTI; i <= N; ++i) {
				for (j = 1; j <= MP; ++j) {
					imj = i - j;
					E[i - 1] -= P[j - 1] * W[imj - 1];
				}
			}
		}//340
		if (MQ != 0) {
			for (i = NEXTI; i <= N; ++i) {
				for (j = 1; j <= MQ; ++j) {
					imj = i - j;
					E[i - 1] += Q[j - 1] * E[imj - 1];
				}
			}
		}
		for (i = NEXTI; i <= N; ++i) {
			*ssq += E[i - 1] * E[i - 1];
		}
	}
	/*
	mdisplay(VW, 1, MRP1);
	mdisplay(VL, 1, MRP1);
	mdisplay(VK, 1, MR);
	*/
	*fact = pow(DETMAN, one / (double)N) * pow(two, DETCAR / (double)N);

	return ifault;
}